

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Belief.cpp
# Opt level: O1

void __thiscall Belief::Set(Belief *this,vector<double,_std::allocator<double>_> *belief)

{
  SDV *this_00;
  
  this_00 = &(this->_m_b).super_SDV;
  std::vector<double,_std::allocator<double>_>::resize
            (this_00,(long)(belief->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(belief->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 3);
  if (this_00 != belief) {
    std::vector<double,_std::allocator<double>_>::operator=(this_00,belief);
    return;
  }
  return;
}

Assistant:

void Belief::Set(const vector<double> &belief)
{
    _m_b.resize(belief.size());
    _m_b=belief;
#if Belief_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
}